

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Pack_external
              (char *datarep,void *inbuf,int incount,MPIABI_Datatype datatype,void *outbuf,
              MPIABI_Aint outsize,MPIABI_Aint *position)

{
  int iVar1;
  
  iVar1 = MPI_Pack_external();
  return iVar1;
}

Assistant:

int MPIABI_Pack_external(
  const char * datarep,
  const void * inbuf,
  int incount,
  MPIABI_Datatype datatype,
  void * outbuf,
  MPIABI_Aint outsize,
  MPIABI_Aint * position
) {
  return MPI_Pack_external(
    datarep,
    inbuf,
    incount,
    (MPI_Datatype)(WPI_Datatype)datatype,
    outbuf,
    (MPI_Aint)(WPI_Aint)outsize,
    (MPI_Aint *)(WPI_Aint *)position
  );
}